

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandDELE(FtpSession *this,string *param)

{
  bool bVar1;
  FileType FVar2;
  int iVar3;
  FileStatus *this_00;
  string local_path;
  FileStatus file_status;
  allocator local_109;
  string local_108;
  string local_e8;
  FileStatus local_c8;
  
  if ((this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    ::std::__cxx11::string::string((string *)&local_c8,"Not logged in",(allocator *)&local_e8);
    sendFtpMessage(this,NOT_LOGGED_IN,&local_c8.path_);
    this_00 = &local_c8;
  }
  else {
    toLocalPath(&local_e8,this,param);
    Filesystem::FileStatus::FileStatus(&local_c8,(string *)&local_e8);
    bVar1 = Filesystem::FileStatus::isOk(&local_c8);
    if (bVar1) {
      FVar2 = Filesystem::FileStatus::type(&local_c8);
      if (FVar2 == RegularFile) {
        if ((((this->logged_in_user_).
              super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->permissions_
            & FileDelete) == None) {
          ::std::__cxx11::string::string((string *)&local_108,"Permission denied",&local_109);
          sendFtpMessage(this,ACTION_NOT_TAKEN,&local_108);
        }
        else {
          iVar3 = unlink(local_e8._M_dataplus._M_p);
          if (iVar3 == 0) {
            ::std::__cxx11::string::string
                      ((string *)&local_108,"Successfully deleted file",&local_109);
            sendFtpMessage(this,FILE_ACTION_COMPLETED,&local_108);
          }
          else {
            ::std::__cxx11::string::string((string *)&local_108,"Unable to delete file",&local_109);
            sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,&local_108);
          }
        }
      }
      else {
        ::std::__cxx11::string::string((string *)&local_108,"Resource is not a file",&local_109);
        sendFtpMessage(this,ACTION_NOT_TAKEN,&local_108);
      }
    }
    else {
      ::std::__cxx11::string::string((string *)&local_108,"Resource does not exist",&local_109);
      sendFtpMessage(this,ACTION_NOT_TAKEN,&local_108);
    }
    ::std::__cxx11::string::~string((string *)&local_108);
    Filesystem::FileStatus::~FileStatus(&local_c8);
    this_00 = (FileStatus *)&local_e8;
  }
  ::std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void FtpSession::handleFtpCommandDELE(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }
    std::string local_path = toLocalPath(param);

    auto file_status = Filesystem::FileStatus(local_path);

    if (!file_status.isOk())
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Resource does not exist");
      return;
    }
    else if (file_status.type() != Filesystem::FileType::RegularFile)
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Resource is not a file");
      return;
    }
    else
    {
      if (static_cast<int>(logged_in_user_->permissions_ & Permission::FileDelete) == 0)
      {
        sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
        return;
      }
      else
      {
#ifdef WIN32
        if (DeleteFileW(StrConvert::Utf8ToWide(local_path).c_str()) != 0)
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully deleted file");
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Unable to delete file: " + GetLastErrorStr());
          return;
        }
#else
        if (unlink(local_path.c_str()) == 0)
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully deleted file");
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Unable to delete file");
          return;
        }
#endif
      }
    }
  }